

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u16 cellSizePtrTableLeaf(MemPage *pPage,u8 *pCell)

{
  uint uVar1;
  byte *pbVar2;
  bool local_31;
  uint local_2c;
  int minLocal;
  u32 nSize;
  u8 *pEnd;
  u8 *pIter;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  local_2c = (uint)*pCell;
  pEnd = pCell;
  if (0x7f < local_2c) {
    local_2c = local_2c & 0x7f;
    pEnd = pCell;
    do {
      pbVar2 = pEnd + 1;
      local_2c = local_2c << 7 | pEnd[1] & 0x7f;
      local_31 = 0x7f < *pbVar2 && pbVar2 < pCell + 8;
      pEnd = pbVar2;
    } while (local_31);
  }
  pbVar2 = pEnd + 2;
  if ((((((pEnd[1] & 0x80) != 0) && (pbVar2 = pEnd + 3, (pEnd[2] & 0x80) != 0)) &&
       (pbVar2 = pEnd + 4, (pEnd[3] & 0x80) != 0)) &&
      ((pbVar2 = pEnd + 5, (pEnd[4] & 0x80) != 0 && (pbVar2 = pEnd + 6, (pEnd[5] & 0x80) != 0)))) &&
     ((pbVar2 = pEnd + 7, (pEnd[6] & 0x80) != 0 &&
      ((pbVar2 = pEnd + 8, (pEnd[7] & 0x80) != 0 && (pbVar2 = pEnd + 9, (pEnd[8] & 0x80) != 0))))))
  {
    pbVar2 = pEnd + 10;
  }
  pEnd = pbVar2;
  if (pPage->maxLocal < local_2c) {
    uVar1 = (uint)pPage->minLocal;
    local_2c = uVar1 + (local_2c - uVar1) % (pPage->pBt->usableSize - 4);
    if (pPage->maxLocal < local_2c) {
      local_2c = uVar1;
    }
    local_2c._0_2_ = ((short)pEnd - (short)pCell) + 4 + (short)local_2c;
  }
  else {
    local_2c = ((int)pEnd - (int)pCell) + local_2c;
    if (local_2c < 4) {
      local_2c = 4;
    }
  }
  return (u16)local_2c;
}

Assistant:

static u16 cellSizePtrTableLeaf(MemPage *pPage, u8 *pCell){
  u8 *pIter = pCell;   /* For looping over bytes of pCell */
  u8 *pEnd;            /* End mark for a varint */
  u32 nSize;           /* Size value to return */

#ifdef SQLITE_DEBUG
  /* The value returned by this function should always be the same as
  ** the (CellInfo.nSize) value found by doing a full parse of the
  ** cell. If SQLITE_DEBUG is defined, an assert() at the bottom of
  ** this function verifies that this invariant is not violated. */
  CellInfo debuginfo;
  pPage->xParseCell(pPage, pCell, &debuginfo);
#endif

  nSize = *pIter;
  if( nSize>=0x80 ){
    pEnd = &pIter[8];
    nSize &= 0x7f;
    do{
      nSize = (nSize<<7) | (*++pIter & 0x7f);
    }while( *(pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;
  /* pIter now points at the 64-bit integer key value, a variable length
  ** integer. The following block moves pIter to point at the first byte
  ** past the end of the key value. */
  if( (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80
   && (*pIter++)&0x80 ){ pIter++; }
  testcase( nSize==pPage->maxLocal );
  testcase( nSize==(u32)pPage->maxLocal+1 );
  if( nSize<=pPage->maxLocal ){
    nSize += (u32)(pIter - pCell);
    if( nSize<4 ) nSize = 4;
  }else{
    int minLocal = pPage->minLocal;
    nSize = minLocal + (nSize - minLocal) % (pPage->pBt->usableSize - 4);
    testcase( nSize==pPage->maxLocal );
    testcase( nSize==(u32)pPage->maxLocal+1 );
    if( nSize>pPage->maxLocal ){
      nSize = minLocal;
    }
    nSize += 4 + (u16)(pIter - pCell);
  }
  assert( nSize==debuginfo.nSize || CORRUPT_DB );
  return (u16)nSize;
}